

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

size_t __thiscall
Memory::LargeHeapBlock::RescanMultiPage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  Recycler *this_00;
  ulong uVar8;
  _func_int **byteCount;
  ObservableValueObserver<Memory::CollectionState> **ppOVar9;
  char *page;
  ObservableValueObserver<Memory::CollectionState> **ppOVar10;
  char *this_01;
  uint index;
  undefined8 *in_FS_OFFSET;
  size_t local_80;
  char *local_68;
  undefined4 *local_50;
  ObservableValueObserver<Memory::CollectionState> **address;
  
  if (this->pageCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_50 = (undefined4 *)*in_FS_OFFSET;
    *local_50 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x56c,"(this->GetPageCount() != 1)","this->GetPageCount() != 1");
    if (!bVar3) {
LAB_002687dc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_50 = 0;
  }
  else {
    local_50 = (undefined4 *)*in_FS_OFFSET;
  }
  bVar3 = (this->super_HeapBlock).needOOMRescan;
  (this->super_HeapBlock).needOOMRescan = false;
  bVar6 = false;
  local_68 = (char *)0x0;
  index = 0;
  local_80 = 0;
  do {
    if (this->allocCount <= index) {
      return local_80;
    }
    this_00 = (Recycler *)GetHeaderByIndex(this,index);
    if (this_00 != (Recycler *)0x0) {
      address = &(this_00->collectionState).observer;
      bVar4 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
      if (bVar4) {
        this_01 = (char *)this_00;
        bVar5 = LargeObjectHeader::GetAttributes((LargeObjectHeader *)this_00,recycler->Cookie);
        if ((bVar5 & 4) != 0 && (char)bVar5 < '\0') {
          psVar1 = &(recycler->collectionStats).finalizeCount;
          *psVar1 = *psVar1 + 1;
          this_01 = (char *)this_00;
          LargeObjectHeader::SetAttributes
                    ((LargeObjectHeader *)this_00,recycler->Cookie,bVar5 & 0xfb);
        }
        if ((bVar5 & 0x20) == 0) {
          byteCount = (this_00->collectionStateChangedObserver).
                      super_ObservableValueObserver<Memory::CollectionState>.
                      _vptr_ObservableValueObserver;
          if ((this->pageHeapData != (PageHeapData *)0x0) &&
             (this->pageHeapData->pageHeapMode != PageHeapModeOff)) {
            byteCount = (_func_int **)((ulong)byteCount & 0xfffffffffffffff8);
          }
          if (byteCount == (_func_int **)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_50 = 1;
            this_01 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x5af,"(objectSize > 0)","objectSize > 0");
            if (!bVar4) goto LAB_002687dc;
            *local_50 = 0;
          }
          if ((bVar3 == false) &&
             (((this_00->collectionState).value & Collection_Parallel) !=
              CollectionStateNotCollecting)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_50 = 1;
            this_01 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x5b0,"(oldNeedOOMRescan || !header->markOnOOMRescan)",
                               "oldNeedOOMRescan || !header->markOnOOMRescan");
            if (!bVar4) goto LAB_002687dc;
            *local_50 = 0;
          }
          if (((this_00->collectionState).value & Collection_Parallel) ==
              CollectionStateNotCollecting) {
            if (recycler->inEndMarkOnLowMemory == false) {
              ppOVar9 = (ObservableValueObserver<Memory::CollectionState> **)
                        ((long)address + (long)byteCount);
              bVar7 = 0;
              do {
                page = (char *)((ulong)address & 0xfffffffffffff000);
                if (local_68 == page) {
                  if (!bVar6) goto LAB_00268791;
LAB_002686ba:
                  ppOVar10 = (ObservableValueObserver<Memory::CollectionState> **)(page + 0x1000);
                  if (ppOVar9 <= page + 0x1000) {
                    ppOVar10 = ppOVar9;
                  }
                  if ((bVar5 & 0x10) != 0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *local_50 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                       ,0x641,"(!(attributes & TrackBit))",
                                       "!(attributes & TrackBit)");
                    if (!bVar6) goto LAB_002687dc;
                    *local_50 = 0;
                  }
                  this_01 = (char *)recycler;
                  bVar6 = Recycler::AddMark(recycler,address,(long)ppOVar10 - (long)address);
                  if (!bVar6) {
                    this_01 = (char *)this;
                    HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
                    bVar7 = *(byte *)((long)&(this_00->collectionState).value + 2);
                    if ((bVar7 & 4) == 0) {
                      *(byte *)((long)&(this_00->collectionState).value + 2) = bVar7 | 1;
                    }
                  }
                  psVar1 = &(recycler->collectionStats).markData.rescanLargePageCount;
                  *psVar1 = *psVar1 + 1;
                  psVar1 = &(recycler->collectionStats).markData.rescanLargeByteCount;
                  *psVar1 = *psVar1 + ((long)ppOVar10 - (long)address);
                  local_80 = local_80 + 1;
                  bVar6 = true;
                  bVar7 = 1;
                }
                else {
                  bVar6 = IsPageDirty((LargeHeapBlock *)this_01,page,(RescanFlags)ppOVar9,
                                      (bool)((*(byte *)((long)&(this_00->collectionState).value + 2)
                                             & 2) >> 1));
                  local_68 = page;
                  if (bVar6) goto LAB_002686ba;
LAB_00268791:
                  ppOVar10 = (ObservableValueObserver<Memory::CollectionState> **)(page + 0x1000);
                  bVar6 = false;
                }
                address = ppOVar10;
              } while (ppOVar10 < ppOVar9);
              uVar8 = (ulong)bVar7;
            }
            else {
              uVar8 = 0;
            }
          }
          else {
            if ((bVar5 & 0x10) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_50 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x5c3,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
              if (!bVar4) goto LAB_002687dc;
              *local_50 = 0;
            }
            bVar4 = Recycler::AddMark(recycler,address,(size_t)byteCount);
            if (!bVar4) {
              HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
              bVar5 = *(byte *)((long)&(this_00->collectionState).value + 2);
              if ((bVar5 & 4) == 0) {
                *(byte *)((long)&(this_00->collectionState).value + 2) = bVar5 | 1;
              }
              if (recycler->inEndMarkOnLowMemory != false) {
                return local_80;
              }
              goto LAB_00268638;
            }
            bVar5 = *(byte *)((long)&(this_00->collectionState).value + 2);
            if ((bVar5 & 4) == 0) {
              *(byte *)((long)&(this_00->collectionState).value + 2) = bVar5 & 0xfa;
            }
            uVar8 = 1;
          }
          psVar1 = &(recycler->collectionStats).markData.rescanLargeObjectCount;
          *psVar1 = *psVar1 + uVar8;
        }
      }
    }
LAB_00268638:
    index = index + 1;
  } while( true );
}

Assistant:

size_t
LargeHeapBlock::RescanMultiPage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() != 1);
    DebugOnly(bool oldNeedOOMRescan = this->needOOMRescan);

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

    size_t rescanCount = 0;
    uint objectIndex = 0;
#if ENABLE_CONCURRENT_GC
    char * lastPageCheckedForWriteWatch = nullptr;
    bool isLastPageCheckedForWriteWatchDirty = false;
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    while (objectIndex < allocCount)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        objectIndex++;

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct.  Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

#ifdef RECYCLER_STATS
        bool objectScanned = false;
#endif

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif

        Assert(objectSize > 0);
        Assert(oldNeedOOMRescan || !header->markOnOOMRescan);
        // Avoid writing to the page unnecessary by checking first
        if (header->markOnOOMRescan)
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                if (!header->isObjectPageLocked)
#endif
                {
                    header->markOnOOMRescan = true;
                }

                // We need to bail out of rescan early only if the recycler is
                // trying to finish marking because of low memory. If this is
                // a regular rescan, we want to try and rescan all the objects
                // on the page. It's possible that the rescan OOMs but if the
                // object rescan does OOM, we'll set the right bit on the
                // object header. When we later rescan it in a low memory
                // situation, when the bit is set, we don't need to check for
                // write-watch etc. since we'd have already done that before
                // setting the bit in the non-low-memory rescan case.
                if (!recycler->inEndMarkOnLowMemory)
                {
                    continue;
                }

                return rescanCount;
            }
#ifdef RECYCLER_PAGE_HEAP
            if (!header->isObjectPageLocked)
#endif
            {
                header->markOnOOMRescan = false;
            }
#ifdef RECYCLER_STATS
            objectScanned = true;
#endif
        }
#if ENABLE_CONCURRENT_GC
        else if (!recycler->inEndMarkOnLowMemory)
        {
            char * objectAddressEnd = objectAddress + objectSize;
            // Walk through the object, checking if any of its pages have been written to
            // If it has, then queue up this object for marking
#ifdef RECYCLER_VISITED_HOST
            bool tracedObject = attributes & TrackBit;
            char * objectAddressStart = objectAddress;
#endif
            do
            {
                char * pageStart = (char *)(((size_t)objectAddress) & ~(size_t)(AutoSystemInfo::PageSize - 1));

                /*
                * The rescan logic for large conservatively scanned object is as follows:
                *  - We rescan the object if it was marked during concurrent mark
                *  - If it was marked, since the large object has multiple pages, we'll rescan only the parts that were changed
                *  - So for each page in the large object, check if it's been written to, and if it hasn't, skip looking at that region
                *  - If we can't get the write watch, rescan that region
                *  - However, this logic applies only if we're not rescanning because of an OOM
                *  - If we are rescanning this object because of OOM (i.e !rescanBecauseOfOOM = false), rescan the whole object
                * For large traced objects we rescan the object and if one of its pages has changed we will rescan the entire object
                *
                * We cache the result of the write watch and the page that it was checked on so that we don't call GetWriteWatch on the same
                * page twice and inadvertently reset the write watch on a page where we've already scanned an object
                */
                if (lastPageCheckedForWriteWatch != pageStart)
                {
                    lastPageCheckedForWriteWatch = pageStart;
                    isLastPageCheckedForWriteWatchDirty = true;
                    bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
                    hasWriteBarrier = header->hasWriteBarrier;
#endif
                    if (!IsPageDirty(pageStart, flags, hasWriteBarrier))
                    {
                        // Fall through to the case below where we'll update objectAddress and continue
                        isLastPageCheckedForWriteWatchDirty = false;
                    }
                }

                if (!isLastPageCheckedForWriteWatchDirty)
                {
                    objectAddress = pageStart + AutoSystemInfo::PageSize;
                    continue;
                }

                // We're interested in only rescanning the parts of the object that have changed, not the whole
                // object. So just queue that up for marking
                char * checkEnd = min(pageStart + AutoSystemInfo::PageSize, objectAddressEnd);

#ifdef RECYCLER_VISITED_HOST
                if (tracedObject)
                {
                    // The object has one dirty page so we need to trace it
                    if (!recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddressStart)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }
                    else
                    {
                        // Object has been successfully processed, so clear NewTrackBit
                        header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                        RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                    }

                    rescanCount = objectSize / AutoSystemInfo::PageSize +
                        (objectSize % AutoSystemInfo::PageSize != 0 ? 1 : 0);
#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount += rescanCount;
                    recycler->collectionStats.markData.rescanLargeByteCount += objectSize;
#endif
                    // We don't need to continue as we are tracing the whole object
                    break;
                }
                else
#endif
                {
                    Assert(!(attributes & TrackBit));
                    if (!recycler->AddMark(objectAddress, (checkEnd - objectAddress)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }

#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount++;
                    recycler->collectionStats.markData.rescanLargeByteCount += (checkEnd - objectAddress);
#endif
                }

                objectAddress = checkEnd;
                rescanCount++;
            }
            while (objectAddress < objectAddressEnd);
        }
#else
        else
        {
            Assert(recycler->inEndMarkOnLowMemory);
        }
#endif
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeObjectCount, objectScanned);
    }

    return rescanCount;
}